

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int get_command_idx(char *command)

{
  int iVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  bVar2 = flags.debug;
  iVar1 = -1;
  iVar3 = iVar1;
  if ((command != (char *)0x0) && (*command != '\0')) {
    iVar4 = 0;
    for (lVar5 = 0x2fc6e0;
        (iVar3 = iVar1, *(char **)(lVar5 + -0x20) != (char *)0x0 &&
        ((iVar3 = strcmp(command,*(char **)(lVar5 + -0x20)), iVar3 != 0 ||
         ((iVar3 = iVar4, bVar2 == '\0' && ((*(byte *)(lVar5 + 1) & 0x40) != 0))))));
        lVar5 = lVar5 + 0x30) {
      iVar4 = iVar4 + 1;
    }
  }
  return iVar3;
}

Assistant:

int get_command_idx(const char *command)
{
	int i;
	
	if (!command || !command[0])
	    return -1;
	
	for (i = 0; cmdlist[i].name; i++)
	    if (!strcmp(command, cmdlist[i].name) &&
		(wizard || !(cmdlist[i].flags & CMD_DEBUG)))
		return i;
	
	return -1;
}